

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  int i;
  long lVar1;
  ImWchar wchars [17];
  
  ImTextStrFromUtf8(wchars,0x11,utf8_chars,(char *)0x0,(char **)0x0);
  for (lVar1 = 0; (lVar1 != 0x11 && (wchars[lVar1] != 0)); lVar1 = lVar1 + 1) {
    AddInputCharacter(this,wchars[lVar1]);
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    // We can't pass more wchars than ImGuiIO::InputCharacters[] can hold so don't convert more
    const int wchars_buf_len = sizeof(ImGuiIO::InputCharacters) / sizeof(ImWchar);
    ImWchar wchars[wchars_buf_len];
    ImTextStrFromUtf8(wchars, wchars_buf_len, utf8_chars, NULL);
    for (int i = 0; i < wchars_buf_len && wchars[i] != 0; i++)
        AddInputCharacter(wchars[i]);
}